

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O3

ChannelList *
Imf_3_4::channelsInView
          (ChannelList *__return_storage_ptr__,string *viewName,ChannelList *channelList,
          StringVector *multiView)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  const_iterator cVar3;
  ConstIterator CVar4;
  string view;
  allocator<char> local_79;
  ChannelList *local_78;
  string local_70;
  string local_50;
  
  p_Var1 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78 = __return_storage_ptr__;
  cVar3._M_node = (_Base_ptr)ChannelList::begin(channelList);
  do {
    CVar4 = ChannelList::end(channelList);
    if ((const_iterator)cVar3._M_node == CVar4._i._M_node) {
      return local_78;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,(char *)(cVar3._M_node + 1),&local_79);
    viewFromChannelName(&local_70,&local_50,multiView);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_70._M_string_length == viewName->_M_string_length) {
      if (local_70._M_string_length != 0) {
        iVar2 = bcmp(local_70._M_dataplus._M_p,(viewName->_M_dataplus)._M_p,
                     local_70._M_string_length);
        if (iVar2 != 0) goto LAB_001923de;
      }
      ChannelList::insert(local_78,(char *)(cVar3._M_node + 1),(Channel *)(cVar3._M_node + 9));
    }
LAB_001923de:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
  } while( true );
}

Assistant:

ChannelList
channelsInView (
    const string&       viewName,
    const ChannelList&  channelList,
    const StringVector& multiView)
{
    //
    // Return a list of all channels belonging to view viewName.
    //

    ChannelList q;

    for (ChannelList::ConstIterator i = channelList.begin ();
         i != channelList.end ();
         ++i)
    {
        //
        // Get view name for this channel
        //

        string view = viewFromChannelName (i.name (), multiView);

        //
        // Insert channel into q if it's a member of view viewName
        //

        if (view == viewName) q.insert (i.name (), i.channel ());
    }

    return q;
}